

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1541.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined8 *__arg;
  pthread_t *__newthread;
  pthread_t tid [67];
  initurl url [67];
  pthread_t local_898 [68];
  undefined8 local_678 [201];
  
  __newthread = local_898;
  curl_global_init(3);
  uVar2 = curl_share_init();
  curl_share_setopt(uVar2,3,lock_cb);
  curl_share_setopt(uVar2,4,unlock_cb);
  curl_share_setopt(uVar2,1,5);
  pthread_mutex_init((pthread_mutex_t *)&connlock,(pthread_mutexattr_t *)0x0);
  __arg = local_678;
  uVar3 = 0;
  do {
    *__arg = URL;
    __arg[1] = uVar2;
    *(int *)(__arg + 2) = (int)uVar3;
    iVar1 = pthread_create(__newthread,(pthread_attr_t *)0x0,run_thread,__arg);
    if (iVar1 == 0) {
      curl_mfprintf(_stderr,"Thread %d, gets %s\n",uVar3 & 0xffffffff,URL);
    }
    else {
      curl_mfprintf(_stderr,"Couldn\'t run thread number %d, errno %d\n",uVar3 & 0xffffffff,iVar1);
    }
    uVar3 = uVar3 + 1;
    __newthread = __newthread + 1;
    __arg = __arg + 3;
  } while (uVar3 != 0x43);
  uVar3 = 0;
  do {
    pthread_join(local_898[uVar3],(void **)0x0);
    curl_mfprintf(_stderr,"Thread %d terminated\n",uVar3 & 0xffffffff);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x43);
  pthread_mutex_destroy((pthread_mutex_t *)&connlock);
  curl_share_cleanup(uVar2);
  curl_global_cleanup();
  return 0;
}

Assistant:

int test(char *URL)
{
  pthread_t tid[NUM_THREADS];
  int i;
  CURLSH *share;
  struct initurl url[NUM_THREADS];

  /* Must initialize libcurl before any threads are started */
  curl_global_init(CURL_GLOBAL_ALL);

  share = curl_share_init();
  curl_share_setopt(share, CURLSHOPT_LOCKFUNC, lock_cb);
  curl_share_setopt(share, CURLSHOPT_UNLOCKFUNC, unlock_cb);
  curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_CONNECT);

  init_locks();

  for(i = 0; i< NUM_THREADS; i++) {
    int error;
    url[i].url = URL;
    url[i].share = share;
    url[i].threadno = i;
    error = pthread_create(&tid[i], NULL, run_thread, &url[i]);
    if(0 != error)
      fprintf(stderr, "Couldn't run thread number %d, errno %d\n", i, error);
    else
      fprintf(stderr, "Thread %d, gets %s\n", i, URL);
  }

  /* now wait for all threads to terminate */
  for(i = 0; i< NUM_THREADS; i++) {
    pthread_join(tid[i], NULL);
    fprintf(stderr, "Thread %d terminated\n", i);
  }

  kill_locks();

  curl_share_cleanup(share);
  curl_global_cleanup();
  return 0;
}